

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v6::internal::bigint::remove_leading_zeros(bigint *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = (int)uVar5;
  uVar5 = uVar5 & 0xffffffff;
  iVar4 = 1;
  if (iVar2 < 1) {
    iVar4 = iVar2;
  }
  iVar2 = iVar2 + 1;
  do {
    iVar3 = iVar4;
    if ((int)uVar5 < 2) break;
    iVar2 = iVar2 + -1;
    lVar1 = uVar5 - 1;
    uVar5 = uVar5 - 1;
    iVar3 = iVar2;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[lVar1] == 0);
  uVar5 = (ulong)iVar3;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar5) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar5);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(num_bigits + 1);
  }